

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_align_quad(REF_GRID ref_grid)

{
  REF_MIGRATE_PARTIONER RVar1;
  REF_NODE ref_node;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_CLOUD ref_cloud;
  REF_GEOM ref_geom;
  uint uVar4;
  REF_ADJ_ITEM pRVar5;
  undefined8 uVar6;
  REF_CELL pRVar7;
  long lVar8;
  char *pcVar9;
  REF_INT node;
  long lVar10;
  double dVar11;
  REF_INT new_node;
  REF_INT id;
  REF_DBL xyz [3];
  REF_LIST previous_list;
  REF_CLOUD previous_cloud;
  REF_CLOUD next_cloud;
  REF_GLOB global;
  REF_INT closest_node;
  REF_DBL dist;
  REF_DBL d [12];
  REF_DBL uv [2];
  REF_DBL m [6];
  int local_188;
  REF_INT local_184;
  REF_CAVITY local_180;
  REF_DBL local_178;
  double dStack_170;
  double local_168;
  double local_158;
  double dStack_150;
  double local_148;
  REF_LIST local_138;
  REF_CLOUD local_130;
  REF_LIST local_128;
  REF_CLOUD local_120;
  REF_MIGRATE_PARTIONER local_114;
  REF_CELL local_110;
  REF_GLOB local_108;
  REF_LIST local_100;
  REF_CLOUD local_f8;
  REF_GEOM local_f0;
  REF_INT local_e4;
  REF_DBL local_e0;
  double local_d8 [3];
  double local_c0;
  double local_b8;
  double local_b0;
  REF_DBL local_78 [2];
  REF_DBL local_68 [7];
  
  RVar1 = ref_grid->partitioner;
  ref_grid->partitioner = REF_MIGRATE_SINGLE;
  uVar4 = ref_migrate_to_balance(ref_grid);
  if (uVar4 == 0) {
    uVar4 = ref_cloud_create(&local_130,3);
    if (uVar4 == 0) {
      uVar4 = ref_list_create(&local_138);
      if (uVar4 == 0) {
        ref_node = ref_grid->node;
        local_114 = RVar1;
        if (0 < ref_node->max) {
          local_f8 = local_130;
          local_100 = local_138;
          local_f0 = ref_grid->geom;
          pRVar7 = ref_grid->cell[0];
          lVar10 = 0;
          local_110 = pRVar7;
          do {
            if (((-1 < ref_node->global[lVar10]) && (lVar10 < pRVar7->ref_adj->nnode)) &&
               (pRVar7->ref_adj->first[lVar10] != -1)) {
              pRVar7 = ref_grid->cell[0];
              local_178 = 0.0;
              dStack_170 = 0.0;
              local_168 = 0.0;
              pRVar2 = pRVar7->ref_adj;
              if ((lVar10 < pRVar2->nnode) && (lVar8 = (long)pRVar2->first[lVar10], lVar8 != -1)) {
                pRVar5 = pRVar2->item;
                do {
                  uVar4 = ref_layer_interior_seg_normal(ref_grid,pRVar5[lVar8].ref,&local_158);
                  if (uVar4 != 0) {
                    pcVar9 = "normal";
                    uVar6 = 0x20f;
                    goto LAB_001ef056;
                  }
                  local_178 = local_158 + local_178;
                  dStack_170 = dStack_150 + dStack_170;
                  local_168 = local_148 + local_168;
                  pRVar5 = pRVar7->ref_adj->item;
                  lVar8 = (long)pRVar5[(int)lVar8].next;
                } while (lVar8 != -1);
              }
              uVar4 = ref_math_normalize(&local_178);
              if (uVar4 == 0) {
                node = (REF_INT)lVar10;
                uVar4 = ref_node_metric_get(ref_node,node,local_68);
                if (uVar4 != 0) {
                  pcVar9 = "get";
                  uVar6 = 0x227;
                  goto LAB_001ef081;
                }
                uVar4 = ref_matrix_diag_m(local_68,local_d8);
                if (uVar4 != 0) {
                  pcVar9 = "eigen decomp";
                  uVar6 = 0x228;
                  goto LAB_001ef081;
                }
                uVar4 = ref_matrix_descending_eig_twod(local_d8);
                ref_geom = local_f0;
                if (uVar4 != 0) {
                  pcVar9 = "2D eig sort";
                  uVar6 = 0x229;
                  goto LAB_001ef081;
                }
                dVar11 = local_168 * local_b0 + local_178 * local_c0 + dStack_170 * local_b8;
                if (dVar11 <= -dVar11) {
                  dVar11 = -dVar11;
                }
                pRVar7 = local_110;
                if (dVar11 <= 0.9848) goto LAB_001eefb3;
                if (local_d8[0] < 0.0) {
                  dVar11 = sqrt(local_d8[0]);
                }
                else {
                  dVar11 = SQRT(local_d8[0]);
                }
                dVar11 = 1.0 / dVar11;
                pRVar3 = ref_node->real;
                local_158 = local_178 * dVar11 + pRVar3[lVar10 * 0xf];
                dStack_150 = dStack_170 * dVar11 + pRVar3[lVar10 * 0xf + 1];
                local_148 = dVar11 * local_168 + pRVar3[lVar10 * 0xf + 2];
                uVar4 = ref_node_nearest_xyz(ref_node,&local_158,&local_e4,&local_e0);
                if (uVar4 != 0) {
                  pcVar9 = "close";
                  uVar6 = 0x237;
                  goto LAB_001ef081;
                }
                uVar4 = ref_node_next_global(ref_node,&local_108);
                if (uVar4 != 0) {
                  pcVar9 = "global";
                  uVar6 = 0x238;
                  goto LAB_001ef081;
                }
                uVar4 = ref_cloud_push(local_f8,local_108,&local_178);
                if (uVar4 != 0) {
                  pcVar9 = "store cloud";
                  uVar6 = 0x239;
                  goto LAB_001ef081;
                }
                uVar4 = ref_list_push(local_100,node);
                if (uVar4 != 0) {
                  pcVar9 = "store list";
                  uVar6 = 0x23a;
                  goto LAB_001ef081;
                }
                uVar4 = ref_node_add(ref_node,local_108,&local_188);
                if (uVar4 != 0) {
                  pcVar9 = "add";
                  uVar6 = 0x23b;
                  goto LAB_001ef081;
                }
                pRVar3 = ref_node->real;
                lVar8 = (long)local_188;
                pRVar3[lVar8 * 0xf] = local_158;
                pRVar3[lVar8 * 0xf + 1] = dStack_150;
                pRVar3[lVar8 * 0xf + 2] = local_148;
                uVar4 = ref_geom_unique_id(ref_geom,node,2,&local_184);
                if (uVar4 != 0) {
                  pcVar9 = "unique face id";
                  uVar6 = 0x240;
                  goto LAB_001ef081;
                }
                uVar4 = ref_geom_tuv(ref_geom,node,2,local_184,local_78);
                if (uVar4 != 0) {
                  pcVar9 = "uv";
                  uVar6 = 0x241;
                  goto LAB_001ef081;
                }
                uVar4 = ref_egads_inverse_eval(ref_geom,2,local_184,&local_158,local_78);
                if (uVar4 != 0) {
                  pcVar9 = "inverse uv";
                  uVar6 = 0x242;
                  goto LAB_001ef081;
                }
                uVar4 = ref_geom_add(ref_geom,local_188,2,local_184,local_78);
                if (uVar4 != 0) {
                  pcVar9 = "new geom";
                  uVar6 = 0x243;
                  goto LAB_001ef081;
                }
                uVar4 = ref_metric_interpolate_between(ref_grid,node,-1,local_188);
                if (uVar4 != 0) {
                  pcVar9 = "metric interp";
                  uVar6 = 0x245;
                  goto LAB_001ef081;
                }
                uVar4 = ref_cavity_create(&local_180);
                if (uVar4 != 0) {
                  pcVar9 = "cav create";
                  uVar6 = 0x246;
                  goto LAB_001ef081;
                }
                uVar4 = ref_cavity_form_insert(local_180,ref_grid,local_188,node,-1,-1);
                if (uVar4 != 0) {
                  pcVar9 = "ball";
                  uVar6 = 0x249;
                  goto LAB_001ef081;
                }
                uVar4 = ref_cavity_enlarge_conforming(local_180);
                if (uVar4 == 0) {
                  uVar4 = ref_cavity_replace(local_180);
                  if (uVar4 == 0) {
                    uVar4 = ref_cavity_free(local_180);
                    pRVar7 = local_110;
                    if (uVar4 == 0) goto LAB_001eefb3;
                    pcVar9 = "cav free";
                    uVar6 = 0x255;
                    goto LAB_001ef081;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x254,"ref_layer_align_first_layer",(ulong)uVar4,"cav replace");
                  ref_cavity_tec(local_180,"ref_layer_align_quad_cavity.tec");
                  ref_export_by_extension(ref_grid,"ref_layer_align_quad_mesh.tec");
                  printf("norm %f %f %f dir %f %f %f dot %f\n");
                  printf("new %f %f %f\n",local_158,dStack_150,local_148);
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x24d,"ref_layer_align_first_layer",(ulong)uVar4,"enlarge");
                  ref_cavity_tec(local_180,"cav-fail.tec");
                  ref_export_by_extension(ref_grid,"mesh-fail.tec");
                }
              }
              else {
                pcVar9 = "norm";
                uVar6 = 0x214;
LAB_001ef056:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar6,"ref_layer_twod_normal",(ulong)uVar4,pcVar9);
                pcVar9 = "twod normal";
                uVar6 = 0x226;
LAB_001ef081:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar6,"ref_layer_align_first_layer",(ulong)uVar4,pcVar9);
              }
              pcVar9 = "first layer";
              uVar6 = 0x2b3;
              goto LAB_001ef0ac;
            }
LAB_001eefb3:
            lVar10 = lVar10 + 1;
          } while (lVar10 < ref_node->max);
        }
        uVar4 = ref_layer_quad_right_triangles(ref_grid);
        if (uVar4 == 0) {
          uVar4 = ref_cloud_create(&local_120,3);
          if (uVar4 == 0) {
            uVar4 = ref_list_create(&local_128);
            if (uVar4 == 0) {
              uVar4 = ref_layer_align_quad_advance(ref_grid,local_130,local_138,local_120,local_128)
              ;
              if (uVar4 == 0) {
                uVar4 = ref_cloud_free(local_130);
                if (uVar4 == 0) {
                  uVar4 = ref_list_free(local_138);
                  ref_cloud = local_120;
                  if (uVar4 == 0) {
                    local_130 = local_120;
                    local_138 = local_128;
                    local_120 = (REF_CLOUD)0x0;
                    local_128 = (REF_LIST)0x0;
                    uVar4 = ref_cloud_free(ref_cloud);
                    if (uVar4 == 0) {
                      uVar4 = ref_layer_quad_right_triangles(ref_grid);
                      if (uVar4 == 0) {
                        ref_grid->partitioner = local_114;
                        uVar4 = ref_migrate_to_balance(ref_grid);
                        if (uVar4 == 0) {
                          return 0;
                        }
                        pcVar9 = "migrate to single part";
                        uVar6 = 0x2d1;
                        goto LAB_001ef0d7;
                      }
                      pcVar9 = "tri2qaud";
                      uVar6 = 0x2c5;
                    }
                    else {
                      pcVar9 = "free next cloud";
                      uVar6 = 0x2c3;
                    }
                  }
                  else {
                    pcVar9 = "free previous list";
                    uVar6 = 700;
                  }
                }
                else {
                  pcVar9 = "free previous cloud";
                  uVar6 = 699;
                }
              }
              else {
                pcVar9 = "first layer";
                uVar6 = 0x2ba;
              }
            }
            else {
              pcVar9 = "next list";
              uVar6 = 0x2b7;
            }
          }
          else {
            pcVar9 = "next cloud";
            uVar6 = 0x2b6;
          }
        }
        else {
          pcVar9 = "tri2qaud";
          uVar6 = 0x2b5;
        }
      }
      else {
        pcVar9 = "previous list";
        uVar6 = 0x2b0;
      }
    }
    else {
      pcVar9 = "previous cloud";
      uVar6 = 0x2af;
    }
LAB_001ef0ac:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar6,
           "ref_layer_align_quad_seq",(ulong)uVar4,pcVar9);
    pcVar9 = "quad";
    uVar6 = 0x2cf;
  }
  else {
    pcVar9 = "migrate to single part";
    uVar6 = 0x2ce;
  }
LAB_001ef0d7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar6,
         "ref_layer_align_quad",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_quad(REF_GRID ref_grid) {
  REF_MIGRATE_PARTIONER previous;
  previous = ref_grid_partitioner(ref_grid);
  ref_grid_partitioner(ref_grid) = REF_MIGRATE_SINGLE;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_layer_align_quad_seq(ref_grid), "quad");
  ref_grid_partitioner(ref_grid) = previous;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  return REF_SUCCESS;
}